

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

base_learner * boosting_setup(options_i *options,vw *all)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  void *pvVar5;
  undefined8 uVar6;
  vw *in_RSI;
  long *in_RDI;
  stringstream __msg;
  learner<boosting,_example> *l;
  option_group_definition new_options;
  free_ptr<boosting> data;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff658;
  vw *in_stack_fffffffffffff660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff668;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff670;
  string *in_stack_fffffffffffff678;
  learner<boosting,_example> *in_stack_fffffffffffff680;
  int plineNumber;
  char *in_stack_fffffffffffff688;
  vw_exception *in_stack_fffffffffffff690;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff6a8;
  option_group_definition *in_stack_fffffffffffff6b0;
  allocator *l_00;
  stringstream local_7a8 [16];
  ostream local_798;
  learner<boosting,_example> *local_620;
  undefined4 local_614;
  undefined4 local_5f4;
  undefined8 local_5d0;
  undefined4 local_598;
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8 [2];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [359];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<int> local_1d8 [2];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  string local_28;
  base_learner *local_8;
  
  local_28.field_2._M_allocated_capacity = (size_type)in_RSI;
  local_28.field_2._8_8_ = in_RDI;
  scoped_calloc_or_throw<boosting>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Boosting",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff660,
             (string *)in_stack_fffffffffffff658);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  l_00 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"boosting",l_00);
  std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
            ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36ac58);
  VW::config::make_option<int>(in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
  VW::config::typed_option<int>::keep(local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Online boosting with <N> weak learners",&local_221);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff660,(string *)in_stack_fffffffffffff658);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_fffffffffffff660,
             (typed_option<int> *)in_stack_fffffffffffff658);
  VW::config::option_group_definition::add<int>
            (in_stack_fffffffffffff6b0,(typed_option<int> *)in_stack_fffffffffffff6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"gamma",&local_389);
  std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
            ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36ad56);
  VW::config::make_option<float>(in_stack_fffffffffffff668,(float *)in_stack_fffffffffffff660);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff670,
             (float)((ulong)in_stack_fffffffffffff668 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b0,"weak learner\'s edge (=0.1), used only by online BBM",&local_3b1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff660,(string *)in_stack_fffffffffffff658);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff660,
             (typed_option<float> *)in_stack_fffffffffffff658);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff6b0,(typed_option<float> *)in_stack_fffffffffffff6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"alg",&local_519);
  std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
            ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36ae5b);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff668,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff660);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_4f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"BBM",&local_541);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  default_value(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_568,
             "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
             ,&local_569);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff660,(string *)in_stack_fffffffffffff658);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (*(code *)**(undefined8 **)local_28.field_2._8_8_)(local_28.field_2._8_8_,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"boosting",&local_591);
  bVar1 = (**(code **)(*(long *)local_28.field_2._8_8_ + 8))(local_28.field_2._8_8_,local_590);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    if ((*(bool *)(local_28.field_2._M_allocated_capacity + 0x3439) & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Number of weak learners = ");
      pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                         ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b515);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,pbVar4->N);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    if ((*(bool *)(local_28.field_2._M_allocated_capacity + 0x3439) & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Gamma = ");
      pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                         ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b581);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,pbVar4->gamma);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b5ca);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b5e2);
    local_5d0 = 0xffffffffffffffff;
    std::allocator<long>::allocator((allocator<long> *)0x36b60e);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff680,
               (size_type)in_stack_fffffffffffff678,
               (value_type_conflict6 *)in_stack_fffffffffffff670,
               (allocator_type *)in_stack_fffffffffffff668);
    std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator
              ((allocator<std::vector<long,_std::allocator<long>_>_> *)0x36b64a);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678,
             (value_type *)in_stack_fffffffffffff670,(allocator_type *)in_stack_fffffffffffff668);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b686);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::operator=((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffff670,
                (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffff668);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)in_stack_fffffffffffff670);
    std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
              ((allocator<std::vector<long,_std::allocator<long>_>_> *)0x36b6bc);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff670);
    std::allocator<long>::~allocator((allocator<long> *)0x36b6d6);
    pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                       ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b6e3);
    pbVar4->t = 0;
    pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                       ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b707);
    pbVar4->all = (vw *)local_28.field_2._M_allocated_capacity;
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b720);
    local_5f4 = 0;
    std::allocator<float>::allocator((allocator<float> *)0x36b74b);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff680,
               (size_type)in_stack_fffffffffffff678,
               (value_type_conflict3 *)in_stack_fffffffffffff670,
               (allocator_type *)in_stack_fffffffffffff668);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b787);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff670,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff668);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff670);
    std::allocator<float>::~allocator((allocator<float> *)0x36b7bd);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b7ca);
    local_614 = 0x3f800000;
    std::allocator<float>::allocator((allocator<float> *)0x36b7f5);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff680,
               (size_type)in_stack_fffffffffffff678,
               (value_type_conflict3 *)in_stack_fffffffffffff670,
               (allocator_type *)in_stack_fffffffffffff668);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b831);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff670,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff668);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff670);
    std::allocator<float>::~allocator((allocator<float> *)0x36b867);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b874);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658);
    if (bVar2) {
      setup_base((options_i *)in_stack_fffffffffffff668,in_stack_fffffffffffff660);
      LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b8e8);
      local_620 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                            ((free_ptr<boosting> *)in_stack_fffffffffffff680,
                             (learner<char,_example> *)in_stack_fffffffffffff678,
                             (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff670,
                             (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff668,(size_t)in_stack_fffffffffffff660);
    }
    else {
      std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36b9d3);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658);
      if (bVar2) {
        setup_base((options_i *)in_stack_fffffffffffff668,in_stack_fffffffffffff660);
        LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
        std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                  ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36ba38);
        local_620 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                              ((free_ptr<boosting> *)in_stack_fffffffffffff680,
                               (learner<char,_example> *)in_stack_fffffffffffff678,
                               (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff670,
                               (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff668,(size_t)in_stack_fffffffffffff660);
        LEARNER::learner<boosting,_example>::set_save_load(local_620,save_load);
      }
      else {
        std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                  ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36ba94);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658);
        if (!bVar2) {
          std::__cxx11::stringstream::stringstream(local_7a8);
          plineNumber = (int)((ulong)in_stack_fffffffffffff680 >> 0x20);
          poVar3 = std::operator<<(&local_798,"Unrecognized boosting algorithm: \'");
          pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                             ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36bb7f);
          poVar3 = std::operator<<(poVar3,(string *)&pbVar4->alg);
          std::operator<<(poVar3,"\' Bailing!");
          uVar6 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffff690,in_stack_fffffffffffff688,plineNumber,
                     in_stack_fffffffffffff678);
          __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        setup_base((options_i *)in_stack_fffffffffffff668,in_stack_fffffffffffff660);
        LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
        in_stack_fffffffffffff678 = &local_28;
        std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                  ((unique_ptr<boosting,_void_(*)(void_*)> *)0x36baf9);
        in_stack_fffffffffffff680 =
             LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                       ((free_ptr<boosting> *)in_stack_fffffffffffff680,
                        (learner<char,_example> *)in_stack_fffffffffffff678,
                        (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff670,
                        (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff668,(size_t)in_stack_fffffffffffff660);
        local_620 = in_stack_fffffffffffff680;
        LEARNER::learner<boosting,_example>::set_save_load
                  (in_stack_fffffffffffff680,save_load_sampling);
      }
    }
    LEARNER::learner<boosting,_example>::set_finish
              (in_stack_fffffffffffff680,(_func_void_boosting_ptr *)in_stack_fffffffffffff678);
    LEARNER::learner<boosting,_example>::set_finish_example(local_620,return_example);
    local_8 = LEARNER::make_base<boosting,example>(local_620);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_598 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff660);
  std::unique_ptr<boosting,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<boosting,_void_(*)(void_*)> *)in_stack_fffffffffffff670);
  return local_8;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}